

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::MemPass::AddStores
          (MemPass *this,uint32_t ptr_id,
          queue<spvtools::opt::Instruction_*,_std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
          *insts)

{
  uint32_t id;
  DefUseManager *this_00;
  anon_class_16_2_f7f4a3da local_50;
  function<void_(spvtools::opt::Instruction_*)> local_40;
  queue<spvtools::opt::Instruction_*,_std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
  *local_20;
  queue<spvtools::opt::Instruction_*,_std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
  *insts_local;
  MemPass *pMStack_10;
  uint32_t ptr_id_local;
  MemPass *this_local;
  
  local_20 = insts;
  insts_local._4_4_ = ptr_id;
  pMStack_10 = this;
  this_00 = Pass::get_def_use_mgr(&this->super_Pass);
  id = insts_local._4_4_;
  local_50.insts = local_20;
  local_50.this = this;
  std::function<void(spvtools::opt::Instruction*)>::
  function<spvtools::opt::MemPass::AddStores(unsigned_int,std::queue<spvtools::opt::Instruction*,std::deque<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>>*)::__0,void>
            ((function<void(spvtools::opt::Instruction*)> *)&local_40,&local_50);
  analysis::DefUseManager::ForEachUser(this_00,id,&local_40);
  std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_40);
  return;
}

Assistant:

void MemPass::AddStores(uint32_t ptr_id, std::queue<Instruction*>* insts) {
  get_def_use_mgr()->ForEachUser(ptr_id, [this, insts](Instruction* user) {
    spv::Op op = user->opcode();
    if (IsNonPtrAccessChain(op)) {
      AddStores(user->result_id(), insts);
    } else if (op == spv::Op::OpStore) {
      insts->push(user);
    }
  });
}